

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionMeshCollection.cpp
# Opt level: O2

aphy_error __thiscall
APhyBullet::APhyBulletCollisionMeshCollection::addCollisionMeshAccessorWithTransform
          (APhyBulletCollisionMeshCollection *this,aphy_collision_mesh_accessor *accessor,
          btTransform *transform)

{
  uint uVar1;
  uint uVar2;
  aphy_size aVar3;
  aphy_pointer pvVar4;
  aphy_pointer pvVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  btVector3 local_a0;
  btVector3 local_90;
  btVector3 local_80;
  long local_70;
  aphy_pointer local_68;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  local_68 = accessor->vertices;
  pvVar4 = accessor->indices;
  uVar6 = (ulong)accessor->index_count / 3;
  if (accessor->index_stride == 4) {
    uVar1 = accessor->index_offset;
    local_70 = uVar6 * 0xc;
    for (lVar7 = 0; pvVar5 = local_68, local_70 != lVar7; lVar7 = lVar7 + 0xc) {
      uVar2 = accessor->vertex_offset;
      aVar3 = accessor->vertex_stride;
      uVar6 = (ulong)(*(int *)((long)pvVar4 + lVar7 + (ulong)uVar1) * aVar3);
      uVar8 = (ulong)(*(int *)((long)pvVar4 + lVar7 + (ulong)uVar1 + 4) * aVar3);
      uVar9 = (ulong)(aVar3 * *(int *)((long)pvVar4 + lVar7 + (ulong)uVar1 + 8));
      local_80.m_floats[0] = *(btScalar *)((long)local_68 + uVar6 + uVar2);
      local_80.m_floats[1] = *(btScalar *)((long)local_68 + uVar6 + 4 + (ulong)uVar2);
      local_80.m_floats[2] = *(btScalar *)((long)local_68 + uVar6 + 8 + (ulong)uVar2);
      local_80.m_floats[3] = 0.0;
      local_40 = btTransform::operator()(transform,&local_80);
      local_90.m_floats[0] = *(btScalar *)((long)pvVar5 + uVar8 + uVar2);
      local_90.m_floats[1] = *(btScalar *)((long)pvVar5 + uVar8 + 4 + (ulong)uVar2);
      local_90.m_floats[2] = *(btScalar *)((long)pvVar5 + uVar8 + 8 + (ulong)uVar2);
      local_90.m_floats[3] = 0.0;
      local_50 = btTransform::operator()(transform,&local_90);
      local_a0.m_floats[0] = *(btScalar *)((long)pvVar5 + uVar9 + uVar2);
      local_a0.m_floats[1] = *(btScalar *)((long)pvVar5 + uVar9 + 4 + (ulong)uVar2);
      local_a0.m_floats[2] = *(btScalar *)((long)pvVar5 + uVar9 + 8 + (ulong)uVar2);
      local_a0.m_floats[3] = 0.0;
      local_60 = btTransform::operator()(transform,&local_a0);
      btTriangleMesh::addTriangle(&this->triangleMeshData,&local_40,&local_50,&local_60,false);
    }
  }
  else if (accessor->index_stride == 2) {
    uVar1 = accessor->index_offset;
    local_70 = uVar6 * 6;
    for (lVar7 = 0; pvVar5 = local_68, local_70 != lVar7; lVar7 = lVar7 + 6) {
      uVar2 = accessor->vertex_offset;
      aVar3 = accessor->vertex_stride;
      uVar6 = (ulong)(*(ushort *)((long)pvVar4 + lVar7 + (ulong)uVar1) * aVar3);
      uVar8 = (ulong)(*(ushort *)((long)pvVar4 + lVar7 + (ulong)uVar1 + 2) * aVar3);
      uVar9 = (ulong)(*(ushort *)((long)pvVar4 + lVar7 + (ulong)uVar1 + 4) * aVar3);
      local_80.m_floats[0] = *(btScalar *)((long)local_68 + uVar6 + uVar2);
      local_80.m_floats[1] = *(btScalar *)((long)local_68 + uVar6 + 4 + (ulong)uVar2);
      local_80.m_floats[2] = *(btScalar *)((long)local_68 + uVar6 + 8 + (ulong)uVar2);
      local_80.m_floats[3] = 0.0;
      local_40 = btTransform::operator()(transform,&local_80);
      local_90.m_floats[0] = *(btScalar *)((long)pvVar5 + uVar8 + uVar2);
      local_90.m_floats[1] = *(btScalar *)((long)pvVar5 + uVar8 + 4 + (ulong)uVar2);
      local_90.m_floats[2] = *(btScalar *)((long)pvVar5 + uVar8 + 8 + (ulong)uVar2);
      local_90.m_floats[3] = 0.0;
      local_50 = btTransform::operator()(transform,&local_90);
      local_a0.m_floats[0] = *(btScalar *)((long)pvVar5 + uVar9 + uVar2);
      local_a0.m_floats[1] = *(btScalar *)((long)pvVar5 + uVar9 + 4 + (ulong)uVar2);
      local_a0.m_floats[2] = *(btScalar *)((long)pvVar5 + uVar9 + 8 + (ulong)uVar2);
      local_a0.m_floats[3] = 0.0;
      local_60 = btTransform::operator()(transform,&local_a0);
      btTriangleMesh::addTriangle(&this->triangleMeshData,&local_40,&local_50,&local_60,false);
    }
  }
  return APHY_OK;
}

Assistant:

aphy_error APhyBulletCollisionMeshCollection::addCollisionMeshAccessorWithTransform(aphy_collision_mesh_accessor* accessor, const btTransform &transform)
{
    auto rawIndices = reinterpret_cast<const uint8_t*> (accessor->indices);
    auto rawVertices = reinterpret_cast<const uint8_t*> (accessor->vertices);
    size_t triangleCount = accessor->index_count / 3;
    if(accessor->index_stride == 2)
    {
        auto indices = reinterpret_cast<const uint16_t*> (rawIndices + accessor->index_offset);
        for(size_t t = 0; t < triangleCount; ++t, indices +=3)
        {
            auto i1 = indices[0];
            auto i2 = indices[1];
            auto i3 = indices[2];

            auto v1 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i1*accessor->vertex_stride);
            auto v2 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i2*accessor->vertex_stride);
            auto v3 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i3*accessor->vertex_stride);
            triangleMeshData.addTriangle(
                transform*btVector3(v1[0], v1[1], v1[2]),
                transform*btVector3(v2[0], v2[1], v2[2]),
                transform*btVector3(v3[0], v3[1], v3[2]));
        }

    }
    else if(accessor->index_stride == 4)
    {
        auto indices = reinterpret_cast<const uint32_t*> (rawIndices + accessor->index_offset);
        for(size_t t = 0; t < triangleCount; ++t, indices +=3)
        {
            auto i1 = indices[0];
            auto i2 = indices[1];
            auto i3 = indices[2];

            auto v1 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i1*accessor->vertex_stride);
            auto v2 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i2*accessor->vertex_stride);
            auto v3 = reinterpret_cast<const float*> (rawVertices + accessor->vertex_offset + i3*accessor->vertex_stride);
            triangleMeshData.addTriangle(
                transform*btVector3(v1[0], v1[1], v1[2]),
                transform*btVector3(v2[0], v2[1], v2[2]),
                transform*btVector3(v3[0], v3[1], v3[2]));
        }
    }

    return APHY_OK;
}